

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O2

void __thiscall
xmrig::Threads<xmrig::CpuThreads>::toJSON(Threads<xmrig::CpuThreads> *this,Value *out,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  bool bVar1;
  Document *doc_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  GStack_48;
  StringRefType local_38;
  
  allocator = doc->allocator_;
  bVar1 = has(this);
  if (bVar1) {
    doc_00 = (Document *)get(this);
    local_38.s = "cn/blur";
    local_38.length = 7;
    CpuThreads::toJSON((CpuThreads *)&GStack_48,doc_00);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(out,&local_38,&GStack_48,allocator);
  }
  return;
}

Assistant:

void xmrig::Threads<T>::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    if (has())
    {
        auto &ct = get();
        out.AddMember("cn/blur", ct.toJSON(doc), allocator);
    }   
}